

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Config::~Config(Config *this)

{
  streambuf *psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  (this->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__Config_0016a630;
  std::ios::rdbuf((streambuf *)(&this->m_os + *(long *)(*(long *)&this->m_os + -0x18)));
  if ((this->m_stream).isOwned == true) {
    psVar1 = (this->m_stream).streamBuf;
    if (psVar1 != (streambuf *)0x0) {
      (**(code **)(*(long *)psVar1 + 8))();
    }
    (this->m_stream).streamBuf = (streambuf *)0x0;
    (this->m_stream).isOwned = false;
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&(this->m_testSpec).m_filters);
  std::ios_base::~ios_base((ios_base *)&this->field_0xe8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->m_data).testsOrTags);
  pcVar2 = (this->m_data).processName._M_dataplus._M_p;
  paVar3 = &(this->m_data).processName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_data).name._M_dataplus._M_p;
  paVar3 = &(this->m_data).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_data).outputFilename._M_dataplus._M_p;
  paVar3 = &(this->m_data).outputFilename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_data).reporterName._M_dataplus._M_p;
  paVar3 = &(this->m_data).reporterName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Config() {
            m_os.rdbuf( Catch::cout().rdbuf() );
            m_stream.release();
        }